

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::MaybeLogToEmail(LogSeverity severity,char *message,size_t len)

{
  size_type *psVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type *local_90;
  string subject;
  string to;
  string body;
  
  if ((email_logging_severity_ <= severity) || (fLI::FLAGS_logemaillevel <= severity)) {
    subject.field_2._8_8_ = &to._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&subject.field_2 + 8),*fLS::FLAGS_alsologtoemail_abi_cxx11_,
               fLS::FLAGS_alsologtoemail_abi_cxx11_[1] + *fLS::FLAGS_alsologtoemail_abi_cxx11_);
    if (_DAT_00154180 != 0) {
      if (to._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&subject.field_2 + 8),",");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&subject.field_2 + 8),addresses__abi_cxx11_,_DAT_00154180);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"[LOG] ","");
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d0,*(char **)(LogSeverityNames + (long)severity * 8));
    paVar4 = &pbVar3->field_2;
    local_b0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar4) {
      local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_b0._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b0,": ");
    psVar1 = &body._M_string_length;
    paVar4 = &pbVar3->field_2;
    to.field_2._8_8_ = (pbVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)to.field_2._8_8_ == paVar4) {
      body._M_string_length = paVar4->_M_allocated_capacity;
      body.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar3->field_2 + 8);
      to.field_2._8_8_ = psVar1;
    }
    else {
      body._M_string_length = paVar4->_M_allocated_capacity;
    }
    body._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    __s = glog_internal_namespace_::ProgramInvocationShortName();
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&to.field_2 + 8),__s);
    local_90 = &subject._M_string_length;
    paVar4 = &pbVar3->field_2;
    psVar2 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2 == paVar4) {
      subject._M_string_length = paVar4->_M_allocated_capacity;
      subject.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar3->field_2 + 8);
    }
    else {
      subject._M_string_length = paVar4->_M_allocated_capacity;
      local_90 = psVar2;
    }
    subject._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if ((size_type *)to.field_2._8_8_ != psVar1) {
      operator_delete((void *)to.field_2._8_8_,body._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    hostname_abi_cxx11_();
    to.field_2._8_8_ = psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&to.field_2 + 8),hostname__abi_cxx11_,
               DAT_001541a0 + hostname__abi_cxx11_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&to.field_2 + 8),"\n\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&to.field_2 + 8),message,len);
    SendEmailInternal((char *)subject.field_2._8_8_,(char *)local_90,(char *)to.field_2._8_8_,false)
    ;
    if ((size_type *)to.field_2._8_8_ != psVar1) {
      operator_delete((void *)to.field_2._8_8_,body._M_string_length + 1);
    }
    if (local_90 != &subject._M_string_length) {
      operator_delete(local_90,subject._M_string_length + 1);
    }
    if ((size_type *)subject.field_2._8_8_ != &to._M_string_length) {
      operator_delete((void *)subject.field_2._8_8_,to._M_string_length + 1);
    }
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToEmail(LogSeverity severity,
					    const char* message, size_t len) {
  if (severity >= email_logging_severity_ ||
      severity >= FLAGS_logemaillevel) {
    string to(FLAGS_alsologtoemail);
    if (!addresses_.empty()) {
      if (!to.empty()) {
        to += ",";
      }
      to += addresses_;
    }
    const string subject(string("[LOG] ") + LogSeverityNames[severity] + ": " +
                         glog_internal_namespace_::ProgramInvocationShortName());
    string body(hostname());
    body += "\n\n";
    body.append(message, len);

    // should NOT use SendEmail().  The caller of this function holds the
    // log_mutex and SendEmail() calls LOG/VLOG which will block trying to
    // acquire the log_mutex object.  Use SendEmailInternal() and set
    // use_logging to false.
    SendEmailInternal(to.c_str(), subject.c_str(), body.c_str(), false);
  }
}